

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

bool __thiscall
cmCTestCurl::HttpRequest(cmCTestCurl *this,string *url,string *fields,string *response)

{
  undefined1 *puVar1;
  cmCTest *pcVar2;
  Curl_easy *pCVar3;
  bool bVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined8 uVar7;
  reference pbVar8;
  string local_aa0 [32];
  undefined1 local_a80 [8];
  ostringstream cmCTestLog_msg_5;
  string local_908 [32];
  undefined1 local_8e8 [8];
  ostringstream cmCTestLog_msg_4;
  allocator<char> local_769;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_768;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_760;
  string local_758 [8];
  string curlDebug;
  undefined1 local_718 [8];
  ostringstream cmCTestLog_msg_3;
  allocator<char> local_599;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_598;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_590;
  string local_588 [36];
  CURLcode local_564;
  string local_560 [4];
  CURLcode res;
  undefined1 local_540 [8];
  ostringstream cmCTestLog_msg_2;
  string *h;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  curl_slist *headers;
  vector<char,_std::allocator<char>_> debugData;
  vector<char,_std::allocator<char>_> responseData;
  ostringstream local_350 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  string *response_local;
  string *fields_local;
  string *url_local;
  cmCTestCurl *this_local;
  
  std::__cxx11::string::clear();
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar5 = std::operator<<((ostream *)local_1a8,"HttpRequest\n");
  poVar5 = std::operator<<(poVar5,"url: ");
  poVar5 = std::operator<<(poVar5,(string *)url);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"fields ");
  poVar5 = std::operator<<(poVar5,(string *)fields);
  std::operator<<(poVar5,"\n");
  pcVar2 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
               ,0xca,pcVar6,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  bVar4 = InitCurl(this);
  if (bVar4) {
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_POST);
    pCVar3 = (Curl_easy *)this->Curl;
    uVar7 = std::__cxx11::string::c_str();
    curl_easy_setopt(pCVar3,CURLOPT_POSTFIELDS,uVar7);
    pCVar3 = (Curl_easy *)this->Curl;
    uVar7 = std::__cxx11::string::c_str();
    curl_easy_setopt(pCVar3,CURLOPT_URL,uVar7);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FOLLOWLOCATION,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEFUNCTION,
                     anon_unknown.dwarf_5bfa4c::curlWriteMemoryCallback);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGFUNCTION,
                     anon_unknown.dwarf_5bfa4c::curlDebugCallback);
    puVar1 = &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)puVar1);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&headers);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEDATA,puVar1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGDATA,&headers);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FAILONERROR,1);
    __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
    bVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->HttpHeaders);
    if (!bVar4) {
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->HttpHeaders);
      h = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->HttpHeaders);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&h), bVar4) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_540);
        poVar5 = std::operator<<((ostream *)local_540,"   Add HTTP Header: \"");
        poVar5 = std::operator<<(poVar5,(string *)pbVar8);
        poVar5 = std::operator<<(poVar5,"\"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xe3,pcVar6,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_560);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_540);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)curl_slist_append((curl_slist *)__range2,pcVar6);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,__range2);
    local_564 = curl_easy_perform((Curl_easy *)this->Curl);
    curl_slist_free_all((curl_slist *)__range2);
    bVar4 = std::vector<char,_std::allocator<char>_>::empty
                      ((vector<char,_std::allocator<char>_> *)
                       &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                      );
    if (!bVar4) {
      puVar1 = &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
      local_590._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)puVar1);
      local_598._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)puVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (local_588,local_590,local_598,&local_599);
      std::__cxx11::string::operator=((string *)response,local_588);
      std::__cxx11::string::~string(local_588);
      std::allocator<char>::~allocator(&local_599);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_718);
      poVar5 = std::operator<<((ostream *)local_718,"Curl response: [");
      poVar5 = std::operator<<(poVar5,(string *)response);
      std::operator<<(poVar5,"]\n");
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xef,pcVar6,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string((string *)(curlDebug.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_718);
    }
    bVar4 = std::vector<char,_std::allocator<char>_>::empty
                      ((vector<char,_std::allocator<char>_> *)&headers);
    if (!bVar4) {
      local_760._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)&headers);
      local_768._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)&headers);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (local_758,local_760,local_768,&local_769);
      std::allocator<char>::~allocator(&local_769);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8e8);
      poVar5 = std::operator<<((ostream *)local_8e8,"Curl debug: [");
      poVar5 = std::operator<<(poVar5,local_758);
      std::operator<<(poVar5,"]\n");
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xf4,pcVar6,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_908);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8e8);
      std::__cxx11::string::~string(local_758);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a80);
    poVar5 = std::operator<<((ostream *)local_a80,"Curl res: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_564);
    std::operator<<(poVar5,"\n");
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xf7,pcVar6,(bool)(this->Quiet & 1));
    std::__cxx11::string::~string(local_aa0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a80);
    this_local._7_1_ = local_564 == CURLE_OK;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&headers);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_350);
    std::operator<<((ostream *)local_350,"Initialization of curl failed\n");
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xcc,pcVar6,false);
    std::__cxx11::string::~string
              ((string *)
               &responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    std::__cxx11::ostringstream::~ostringstream(local_350);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCurl::HttpRequest(std::string const& url,
                              std::string const& fields, std::string& response)
{
  response.clear();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "HttpRequest\n"
                       << "url: " << url << "\n"
                       << "fields " << fields << "\n",
                     this->Quiet);
  if (!this->InitCurl()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed\n");
    return false;
  }
  curl_easy_setopt(this->Curl, CURLOPT_POST, 1);
  curl_easy_setopt(this->Curl, CURLOPT_POSTFIELDS, fields.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, url.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_FOLLOWLOCATION, 1);
  // set response options
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION, curlDebugCallback);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, &responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, &debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);

  // Add headers if any were specified.
  struct curl_slist* headers = nullptr;
  if (!this->HttpHeaders.empty()) {
    for (std::string const& h : this->HttpHeaders) {
      cmCTestOptionalLog(this->CTest, DEBUG,
                         "   Add HTTP Header: \"" << h << "\"" << std::endl,
                         this->Quiet);
      headers = ::curl_slist_append(headers, h.c_str());
    }
  }

  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, headers);
  CURLcode res = ::curl_easy_perform(this->Curl);
  ::curl_slist_free_all(headers);

  if (!responseData.empty()) {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl response: [" << response << "]\n", this->Quiet);
  }
  if (!debugData.empty()) {
    std::string curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl debug: [" << curlDebug << "]\n", this->Quiet);
  }
  cmCTestOptionalLog(this->CTest, DEBUG, "Curl res: " << res << "\n",
                     this->Quiet);
  return (res == 0);
}